

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fverify.c
# Opt level: O1

void fverify(void)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  FILE *__stream_00;
  char *pcVar3;
  float fversion;
  char outfile [1025];
  char infile [1025];
  float local_84c;
  char local_848;
  undefined2 uStack_847;
  int iStack_845;
  char local_438;
  char local_437 [1031];
  
  __stream = (FILE *)0x0;
  memset(&local_438,0,0x401);
  pcVar3 = &local_848;
  memset(pcVar3,0,0x401);
  c_ptaskn(task);
  if (local_438 == '@') {
    __stream = fopen64(local_437,"r");
    if (__stream == (FILE *)0x0) {
      sprintf(errmes,"Can not open the list file: %s.",local_437);
      c_fcerr(errmes);
      leave_early((FILE *)0x0);
      return;
    }
  }
  if (local_848 == '!') {
    pcVar3 = (char *)&uStack_847;
  }
  else if (((local_848 != '\0') && (prstat != 0)) &&
          (iStack_845 != 0x54554f ||
           CONCAT13((undefined1)iStack_845,CONCAT21(uStack_847,local_848)) != 0x4f445453)) {
    pcVar3 = &local_848;
    __stream_00 = fopen64(pcVar3,"r");
    if (__stream_00 != (FILE *)0x0) {
      sprintf(errmes,"Clobber is not set. Can not overwrite the file %s.",&local_848);
      c_fcerr(errmes);
      leave_early((FILE *)0x0);
      goto LAB_00106c72;
    }
  }
  iVar2 = prstat;
  if (prstat == 0) {
LAB_00106a31:
    __stream_00 = (FILE *)0x0;
  }
  else {
    __stream_00 = _stdout;
    if ((*pcVar3 != '\0') && (iVar1 = strcmp(pcVar3,"STDOUT"), __stream_00 = _stdout, iVar1 != 0)) {
      if (iVar2 == 0) goto LAB_00106a31;
      __stream_00 = fopen64(pcVar3,"w");
      if (__stream_00 == (FILE *)0x0) {
        sprintf(errmes,"Error opening Ouputput file %s. Using stdout instead.",&local_848);
        c_fcerr(errmes);
        __stream_00 = _stdout;
      }
    }
  }
  wrtout((FILE *)__stream_00," ");
  ffvers(&local_84c);
  sprintf(comm,"%s (CFITSIO V%.3f)",SUB84((double)local_84c,0),task);
  wrtsep((FILE *)__stream_00,' ',comm,0x4b);
  if (comm[0] != '\0') {
    pcVar3 = comm;
    do {
      pcVar3 = pcVar3 + 1;
      pcVar3[-1] = '-';
    } while (*pcVar3 != '\0');
  }
  wrtsep((FILE *)__stream_00,' ',comm,0x4b);
  wrtout((FILE *)__stream_00," ");
  if (err_report == 2) {
    builtin_strncpy(comm + 0x10,"ecking for the most severe FITS format errors.",0x2f);
    builtin_strncpy(comm,"Caution: Only ch",0x10);
    wrtout((FILE *)__stream_00,comm);
  }
  if (heasarc_conv != 0) {
    builtin_strncpy(comm,"HEASARC conventions are being checked.",0x27);
    wrtout((FILE *)__stream_00,comm);
  }
  if (__stream == (FILE *)0x0) {
    iVar2 = verify_fits(&local_438,(FILE *)__stream_00);
    if (__stream_00 == (FILE *)0x0) {
      iVar1 = 1;
      if (iVar2 == 0) {
        iVar1 = get_total_err();
      }
      printf("verification %s: %-20s  nerrors=%d\n",(&PTR_anon_var_dwarf_278_00204aa0)[0 < iVar1],
             &local_438);
    }
  }
  else {
    pcVar3 = fgets(&local_438,0x401,__stream);
    if (pcVar3 != (char *)0x0) {
      do {
        iVar2 = verify_fits(&local_438,(FILE *)__stream_00);
        if (__stream_00 == (FILE *)0x0) {
          iVar1 = 1;
          if (iVar2 == 0) {
            iVar1 = get_total_err();
          }
          printf("verification %s: %-20s  nerrors=%d\n",
                 (&PTR_anon_var_dwarf_278_00204aa0)[0 < iVar1],&local_438);
        }
        iVar2 = 2;
        do {
          wrtout((FILE *)__stream_00," ");
          iVar2 = iVar2 + -1;
        } while (iVar2 != 0);
        pcVar3 = fgets(&local_438,0x401,__stream);
      } while (pcVar3 != (char *)0x0);
    }
    fclose(__stream);
  }
  if (__stream_00 == (FILE *)0x0) {
    return;
  }
  if (__stream_00 == _stdout) {
    return;
  }
LAB_00106c72:
  fclose(__stream_00);
  return;
}

Assistant:

void fverify()
{ 
    char infile[FLEN_FILENAME] = "";  	/* Input Fits file */
    char outfile[FLEN_FILENAME] = "";  	/* output ASCII file */
    char *p;
    int status = 0, vfstatus = 0, filestatus, ferror, fwarn;
    int i, nerrs; 
    FILE* list = NULL;
    FILE *out;				/* output ASCII file pointer */
    float fversion;
    char *status_str[] = {"OK    ", "FAILED"};

    /*------------------Initialization  --------------------------------*/

    c_ptaskn(task);

    /* get the input parameters from parameter file*/
    if(init_fverify(infile, outfile, &status) ) {
        strcpy(errmes,"Errors in init_fverfify.");
        c_fcerr(errmes);
	leave_early(NULL);
	return;
    } 

    /* if infile name has @ in front of it, then it is a file of a list */ 
    p = infile; 
    if (*p == '@') { 
         p++;
	 if( (list = fopen(p,"r")) == NULL ) { 
	        sprintf(errmes,
		    "Can not open the list file: %s.",p);
                c_fcerr(errmes);
	        leave_early(NULL);
		return;
         } 
    }     

    /* if the outfile is given, open it, otherwise, use stdout */
    p = outfile;
    if(*p == '!') { 
	p++;
    } 
    else { 
        if(prstat && strlen(p) && strcmp(p, "STDOUT")) { 
	    if( (out = fopen(p,"r")) != NULL ) { 
	        sprintf(errmes,
		    "Clobber is not set. Can not overwrite the file %s.",p);
                c_fcerr(errmes);
	        leave_early(NULL);
		fclose(out);
		return;
            }
        }
    }

    if(prstat && (!strlen(p) || !strcmp(p, "STDOUT"))) {  
	out = stdout;
    }
    else if (!prstat) {
       out=NULL;
    }  
    else if( (out = fopen(p,"w") ) == NULL) {
            sprintf(errmes,
               "Error opening Ouputput file %s. Using stdout instead.",
	       outfile);
            c_fcerr(errmes);
	    out = stdout;
    }

    wrtout(out," ");
    fits_get_version(&fversion);
    sprintf(comm,"%s (CFITSIO V%.3f)",task,fversion);
    wrtsep(out,' ',comm,75);
    for(i = 0; comm[i]!='\0'; i++) comm[i] = '-';
    wrtsep(out,' ',comm,75);
    wrtout(out," ");
    switch (err_report) {
    case 2:
    sprintf(comm, "Caution: Only checking for the most severe FITS format errors.");
        wrtout(out,comm);
        break;
    case 1:
        break;
    case 0:
        break;
    }

    if(heasarc_conv) {
        sprintf(comm, "HEASARC conventions are being checked.");
	wrtout(out,comm);
    }     

    /* process each file */ 
    if (list == NULL) { 
        vfstatus = verify_fits(infile,out);  

        if (out == NULL) {  /* print one-line file summary */

           /* verify_fits returns a non-zero status for catastrophic
            * file I/O problems (an abort), and in this case total_err
            * is not updated via close_report(), so we need to set
            * nerrs accordingly for the one-line file summary. */
           if (vfstatus) nerrs = 1; else nerrs = get_total_err();

           filestatus = (nerrs>0) ? 1 : 0;
           printf("verification %s: %-20s  nerrors=%d\n", status_str[filestatus],
                   infile, nerrs); 
        }        
    } 
    else { 
       while((p = fgets(infile, FLEN_FILENAME, list))!= NULL) {      
           vfstatus = verify_fits(infile,out);   

           if (out == NULL) { /* print one-line file summary */

              /* verify_fits returns a non-zero status for catastrophic
               * file I/O problems (an abort), and in this case total_err
               * is not updated via close_report(), so we need to set
               * nerrs accordingly for the one-line file summary. */
              if (vfstatus) nerrs = 1; else nerrs = get_total_err();

              filestatus = (nerrs>0) ? 1 : 0;
              printf("verification %s: %-20s  nerrors=%d\n",
                 status_str[filestatus], infile, nerrs); 
           }        

           for (i = 1; i < 3; i++) wrtout(out," ");
       }
       fclose(list);
    }        
 
    /* close the output file  */ 
    if (out != stdout && out != NULL) fclose(out);

    return;
}